

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CEPlanet.cpp
# Opt level: O0

bool __thiscall test_CEPlanet::test_jupiter(test_CEPlanet *this)

{
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  byte bVar1;
  vector<double,_std::allocator<double>_> *in_RDI;
  CEPlanet jupiter;
  CEPlanet *this_00;
  CESkyCoordType *coord_type;
  CEAngle *in_stack_fffffffffffffd40;
  CEAngle *in_stack_fffffffffffffd48;
  allocator_type *__a;
  CESkyCoord *in_stack_fffffffffffffd50;
  vector<double,_std::allocator<double>_> *this_01;
  iterator in_stack_fffffffffffffd58;
  iterator pdVar2;
  size_type in_stack_fffffffffffffd60;
  undefined1 local_288 [32];
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 *local_250;
  undefined8 local_248;
  undefined1 local_240 [24];
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  CEPlanet *in_stack_fffffffffffffde0;
  undefined1 local_1f0 [52];
  undefined4 local_1bc;
  undefined8 local_1b8;
  undefined8 local_1a0;
  undefined1 local_188 [64];
  undefined1 local_148 [328];
  
  CEPlanet::Jupiter();
  coord_type = (CESkyCoordType *)CEDate::JD((CEDate *)(in_RDI + 0x1e));
  CEPlanet::UpdateCoordinates
            (in_stack_fffffffffffffde0,
             (double)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  local_1a0 = 0x404130edfdf612df;
  CEAngle::Deg(in_stack_fffffffffffffd58);
  local_1b8 = 0x402908212c2e9765;
  CEAngle::Deg(in_stack_fffffffffffffd58);
  local_1bc = 1;
  CESkyCoord::CESkyCoord
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
             coord_type);
  CEAngle::Deg(in_stack_fffffffffffffd58);
  CEAngle::Deg(in_stack_fffffffffffffd58);
  CESkyCoord::CESkyCoord
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
             coord_type);
  local_268 = 0x400ff49297f2a579;
  uStack_260 = 0x4005de20b2272f19;
  local_258 = 0x3ff1313ad30fb1fa;
  local_250 = &local_268;
  local_248 = 3;
  std::allocator<double>::allocator((allocator<double> *)0x1207cb);
  __l._M_len = in_stack_fffffffffffffd60;
  __l._M_array = in_stack_fffffffffffffd58;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd50,__l,
             (allocator_type *)in_stack_fffffffffffffd48);
  __a = (allocator_type *)0xbf72a8b99d1a2ca7;
  this_01 = (vector<double,_std::allocator<double>_> *)0x3f78128898c055c6;
  pdVar2 = (iterator)0x3f658bb2d1231dbc;
  this_00 = (CEPlanet *)&stack0xfffffffffffffd47;
  std::allocator<double>::allocator((allocator<double> *)0x12082c);
  __l_00._M_len = in_stack_fffffffffffffd60;
  __l_00._M_array = pdVar2;
  std::vector<double,_std::allocator<double>_>::vector(this_01,__l_00,__a);
  (*(code *)(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start[0x19])
            (in_RDI,local_148,local_188,local_1f0,local_240,local_288);
  std::vector<double,_std::allocator<double>_>::~vector(in_RDI);
  std::allocator<double>::~allocator((allocator<double> *)0x120893);
  std::vector<double,_std::allocator<double>_>::~vector(in_RDI);
  std::allocator<double>::~allocator((allocator<double> *)0x1208aa);
  CESkyCoord::~CESkyCoord((CESkyCoord *)this_00);
  CEAngle::~CEAngle((CEAngle *)0x1208c4);
  CEAngle::~CEAngle((CEAngle *)0x1208d1);
  CESkyCoord::~CESkyCoord((CESkyCoord *)this_00);
  CEAngle::~CEAngle((CEAngle *)0x1208eb);
  CEAngle::~CEAngle((CEAngle *)0x1208f8);
  bVar1 = (*(code *)(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start[3])();
  CEPlanet::~CEPlanet(this_00);
  return (bool)(bVar1 & 1);
}

Assistant:

bool test_CEPlanet::test_jupiter(void)
{
    // Create the planet object
    CEPlanet jupiter = CEPlanet::Jupiter();

    // Update the coordinates
    jupiter.UpdateCoordinates(base_date_.JD());

    // Run the actual test with values derived from AstroPy
    test_planet(jupiter,
                CESkyCoord(CEAngle::Deg(34.3822629405528843), 
                           CEAngle::Deg(12.5158780867456674), 
                           CESkyCoordType::ICRS),
                CESkyCoord(CEAngle::Deg(81.1700048918871886), 
                           CEAngle::Deg(103.2491992750974532), 
                           CESkyCoordType::OBSERVED),
                {3.99442023, 2.7334608, 1.07451899},
                {-0.00455544, 0.00587705, 0.00263009});
    
    return pass();
}